

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

void Sim_UtilSimulateNodeOne(Abc_Obj_t *pNode,Vec_Ptr_t *vSimInfo,int nSimWords,int nOffset)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  int fComp2;
  int fComp1;
  int k;
  uint *pSimmNode2;
  uint *pSimmNode1;
  uint *pSimmNode;
  int nOffset_local;
  int nSimWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simUtils.c"
                  ,0x133,"void Sim_UtilSimulateNodeOne(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
  }
  pvVar3 = Vec_PtrEntry(vSimInfo,pNode->Id);
  iVar1 = Abc_ObjFaninId0(pNode);
  pvVar4 = Vec_PtrEntry(vSimInfo,iVar1);
  iVar1 = Abc_ObjFaninId1(pNode);
  pvVar5 = Vec_PtrEntry(vSimInfo,iVar1);
  iVar1 = Abc_ObjFaninC0(pNode);
  iVar2 = Abc_ObjFaninC1(pNode);
  if ((iVar1 == 0) || (iVar2 == 0)) {
    if ((iVar1 == 0) || (iVar2 != 0)) {
      if ((iVar1 == 0) && (iVar2 != 0)) {
        for (fComp2 = 0; fComp2 < nSimWords; fComp2 = fComp2 + 1) {
          *(uint *)((long)pvVar3 + (long)fComp2 * 4 + (long)nOffset * 4) =
               *(uint *)((long)pvVar4 + (long)fComp2 * 4 + (long)nOffset * 4) &
               (*(uint *)((long)pvVar5 + (long)fComp2 * 4 + (long)nOffset * 4) ^ 0xffffffff);
        }
      }
      else {
        for (fComp2 = 0; fComp2 < nSimWords; fComp2 = fComp2 + 1) {
          *(uint *)((long)pvVar3 + (long)fComp2 * 4 + (long)nOffset * 4) =
               *(uint *)((long)pvVar4 + (long)fComp2 * 4 + (long)nOffset * 4) &
               *(uint *)((long)pvVar5 + (long)fComp2 * 4 + (long)nOffset * 4);
        }
      }
    }
    else {
      for (fComp2 = 0; fComp2 < nSimWords; fComp2 = fComp2 + 1) {
        *(uint *)((long)pvVar3 + (long)fComp2 * 4 + (long)nOffset * 4) =
             (*(uint *)((long)pvVar4 + (long)fComp2 * 4 + (long)nOffset * 4) ^ 0xffffffff) &
             *(uint *)((long)pvVar5 + (long)fComp2 * 4 + (long)nOffset * 4);
      }
    }
  }
  else {
    for (fComp2 = 0; fComp2 < nSimWords; fComp2 = fComp2 + 1) {
      *(uint *)((long)pvVar3 + (long)fComp2 * 4 + (long)nOffset * 4) =
           (*(uint *)((long)pvVar4 + (long)fComp2 * 4 + (long)nOffset * 4) ^ 0xffffffff) &
           (*(uint *)((long)pvVar5 + (long)fComp2 * 4 + (long)nOffset * 4) ^ 0xffffffff);
    }
  }
  return;
}

Assistant:

void Sim_UtilSimulateNodeOne( Abc_Obj_t * pNode, Vec_Ptr_t * vSimInfo, int nSimWords, int nOffset )
{
    unsigned * pSimmNode, * pSimmNode1, * pSimmNode2;
    int k, fComp1, fComp2;
    // simulate the internal nodes
    assert( Abc_ObjIsNode(pNode) );
    pSimmNode  = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
    pSimmNode1 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId0(pNode));
    pSimmNode2 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId1(pNode));
    pSimmNode  += nOffset;
    pSimmNode1 += nOffset;
    pSimmNode2 += nOffset;
    fComp1 = Abc_ObjFaninC0(pNode);
    fComp2 = Abc_ObjFaninC1(pNode);
    if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k] & ~pSimmNode2[k];
    else if ( fComp1 && !fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k] &  pSimmNode2[k];
    else if ( !fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k] & ~pSimmNode2[k];
    else // if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k] &  pSimmNode2[k];
}